

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O1

void __thiscall icu_63::UnicodeSetStringSpan::addToSpanNotSet(UnicodeSetStringSpan *this,UChar32 c)

{
  UBool UVar1;
  UnicodeSet *pUVar2;
  
  pUVar2 = &this->spanSet;
  if (this->pSpanNotSet != pUVar2 && this->pSpanNotSet != (UnicodeSet *)0x0) {
LAB_001a6671:
    UnicodeSet::add(this->pSpanNotSet,c);
    return;
  }
  UVar1 = UnicodeSet::contains(pUVar2,c);
  if (UVar1 == '\0') {
    pUVar2 = (UnicodeSet *)UnicodeSet::cloneAsThawed(pUVar2);
    if (pUVar2 != (UnicodeSet *)0x0) {
      this->pSpanNotSet = pUVar2;
      goto LAB_001a6671;
    }
  }
  return;
}

Assistant:

void UnicodeSetStringSpan::addToSpanNotSet(UChar32 c) {
    if(pSpanNotSet==NULL || pSpanNotSet==&spanSet) {
        if(spanSet.contains(c)) {
            return;  // Nothing to do.
        }
        UnicodeSet *newSet=(UnicodeSet *)spanSet.cloneAsThawed();
        if(newSet==NULL) {
            return;  // Out of memory.
        } else {
            pSpanNotSet=newSet;
        }
    }
    pSpanNotSet->add(c);
}